

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O1

void __thiscall cmCursesMainForm::UpdateProgress(cmCursesMainForm *this,string *msg,float prog)

{
  string *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint __val;
  uint uVar3;
  long *plVar4;
  char cVar5;
  uint uVar6;
  char *pcVar7;
  size_type *psVar8;
  ulong *puVar9;
  ulong uVar10;
  uint uVar11;
  uint __len;
  string __str;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string *local_38;
  
  if (prog < 0.0) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string_const&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->Outputs,
               msg);
    DisplayOutputs(this,msg);
    return;
  }
  uVar11 = (uint)(prog * 100.0);
  pcVar7 = "";
  if ((int)uVar11 < 100) {
    pcVar7 = " ";
  }
  psVar1 = &this->LastProgress;
  local_38 = msg;
  std::__cxx11::string::_M_replace
            ((ulong)psVar1,0,(char *)(this->LastProgress)._M_string_length,(ulong)pcVar7);
  std::__cxx11::string::append((char *)psVar1);
  __val = -uVar11;
  if (0 < (int)uVar11) {
    __val = uVar11;
  }
  __len = 1;
  if (9 < __val) {
    uVar10 = (ulong)__val;
    uVar3 = 4;
    do {
      __len = uVar3;
      uVar6 = (uint)uVar10;
      if (uVar6 < 100) {
        __len = __len - 2;
        goto LAB_00158997;
      }
      if (uVar6 < 1000) {
        __len = __len - 1;
        goto LAB_00158997;
      }
      if (uVar6 < 10000) goto LAB_00158997;
      uVar10 = uVar10 / 10000;
      uVar3 = __len + 4;
    } while (99999 < uVar6);
    __len = __len + 1;
  }
LAB_00158997:
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_58,(char)__len - (char)((int)uVar11 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_58._M_dataplus._M_p + (uVar11 >> 0x1f),__len,__val);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_58);
  paVar2 = &local_78.field_2;
  psVar8 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_78.field_2._M_allocated_capacity = *psVar8;
    local_78.field_2._8_8_ = plVar4[3];
    local_78._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_78.field_2._M_allocated_capacity = *psVar8;
    local_78._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_78._M_string_length = plVar4[1];
  *plVar4 = (long)psVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_78._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  cVar5 = (char)(int)(prog * 40.0);
  std::__cxx11::string::_M_replace_aux((ulong)psVar1,(this->LastProgress)._M_string_length,0,cVar5);
  std::__cxx11::string::_M_replace_aux
            ((ulong)psVar1,(this->LastProgress)._M_string_length,0,'(' - cVar5);
  std::operator+(&local_58,"] ",local_38);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_58);
  puVar9 = (ulong *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar9) {
    local_78.field_2._M_allocated_capacity = *puVar9;
    local_78.field_2._8_8_ = plVar4[3];
    local_78._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_78.field_2._M_allocated_capacity = *puVar9;
    local_78._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_78._M_string_length = plVar4[1];
  *plVar4 = (long)puVar9;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_78._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity =
       local_78.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_78._M_dataplus._M_p = (pointer)paVar2;
  DisplayOutputs(this,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmCursesMainForm::UpdateProgress(const std::string& msg, float prog)
{
  if (prog >= 0) {
    constexpr int progressBarWidth = 40;
    int progressBarCompleted = static_cast<int>(progressBarWidth * prog);
    int percentCompleted = static_cast<int>(100 * prog);
    this->LastProgress = (percentCompleted < 100 ? " " : "");
    this->LastProgress += (percentCompleted < 10 ? " " : "");
    this->LastProgress += std::to_string(percentCompleted) + "% [";
    this->LastProgress.append(progressBarCompleted, '#');
    this->LastProgress.append(progressBarWidth - progressBarCompleted, ' ');
    this->LastProgress += "] " + msg + "...";
    this->DisplayOutputs(std::string());
  } else {
    this->Outputs.emplace_back(msg);
    this->DisplayOutputs(msg);
  }
}